

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_UInt32 tt_synth_sfnt_checksum(FT_Stream stream,FT_ULong length)

{
  byte bVar1;
  byte bVar2;
  FT_Error FVar3;
  FT_ULong FVar4;
  undefined4 local_28;
  FT_UInt i;
  FT_UInt32 checksum;
  FT_Error error;
  FT_ULong length_local;
  FT_Stream stream_local;
  
  local_28 = 0;
  FVar3 = FT_Stream_EnterFrame(stream,length);
  _checksum = length;
  if (FVar3 == 0) {
    for (; 3 < _checksum; _checksum = _checksum - 4) {
      FVar4 = FT_Stream_GetULong(stream);
      local_28 = (int)FVar4 + local_28;
    }
    bVar2 = 3;
    for (; _checksum != 0; _checksum = _checksum - 1) {
      bVar1 = FT_Stream_GetChar(stream);
      local_28 = ((uint)bVar1 << ((bVar2 & 3) << 3)) + local_28;
      bVar2 = bVar2 - 1;
    }
    FT_Stream_ExitFrame(stream);
    stream_local._4_4_ = local_28;
  }
  else {
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

static FT_UInt32
  tt_synth_sfnt_checksum( FT_Stream  stream,
                          FT_ULong   length )
  {
    FT_Error   error;
    FT_UInt32  checksum = 0;
    FT_UInt    i;


    if ( FT_FRAME_ENTER( length ) )
      return 0;

    for ( ; length > 3; length -= 4 )
      checksum += (FT_UInt32)FT_GET_ULONG();

    for ( i = 3; length > 0; length--, i-- )
      checksum += (FT_UInt32)FT_GET_BYTE() << ( i * 8 );

    FT_FRAME_EXIT();

    return checksum;
  }